

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.c
# Opt level: O1

void AbsPath(tchar_t *Abs,int AbsLen,tchar_t *Path,tchar_t *Base)

{
  char cVar1;
  tchar_t *ptVar2;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  size_t OutLen;
  bool_t HasHost;
  long local_30;
  
  OutLen = (size_t)AbsLen;
  if (Base != (tchar_t *)0x0) {
    ptVar2 = GetProtocol(Base,(tchar_t *)0x0,0,(bool_t *)0x0);
    if ((ptVar2 != Base) &&
       ((((*Path == '\\' || (*Path == '/')) && (Path[1] != '/')) && (Path[1] != '\\')))) {
      tcscpy_s(Abs,OutLen,Base);
      __s = GetProtocol(Abs,(tchar_t *)0x0,0,&local_30);
      if (local_30 == 0) {
        Path = Path + 1;
      }
      else {
        pcVar3 = strchr(__s,0x5c);
        pcVar4 = strchr(__s,0x2f);
        if ((pcVar3 == (char *)0x0) || (__s = pcVar3, pcVar4 < pcVar3 && pcVar4 != (char *)0x0)) {
          __s = pcVar4;
        }
        if (__s == (tchar_t *)0x0) goto LAB_001251e6;
      }
      *__s = '\0';
      goto LAB_001251e6;
    }
    ptVar2 = GetProtocol(Path,(tchar_t *)0x0,0,(bool_t *)0x0);
    if ((ptVar2 == Path) &&
       ((cVar1 = *Path, cVar1 == '\0' ||
        (((cVar1 != '/' && (cVar1 != '\\')) &&
         ((Path[1] != ':' || ((Path[2] != '\0' && (Path[2] != '\\')))))))))) {
      ptVar2 = GetProtocol(Base,(tchar_t *)0x0,0,(bool_t *)0x0);
      tcscpy_s(Abs,OutLen,Base);
      if (*ptVar2 != '\0') {
        AddPathDelimiter(Abs,OutLen);
      }
      goto LAB_001251e6;
    }
  }
  *Abs = '\0';
LAB_001251e6:
  tcscat_s(Abs,OutLen,Path);
  AbsPathNormalize(Abs);
  return;
}

Assistant:

void AbsPath(tchar_t* Abs, int AbsLen, const tchar_t* Path, const tchar_t* Base)
{
    if (Base && GetProtocol(Base,NULL,0,NULL)!=Base && (Path[0] == '/' || Path[0] == '\\') &&
        (Path[1] != '/' && Path[1] != '\\'))
    {
        tchar_t* s;
        bool_t HasHost;

        tcscpy_s(Abs,AbsLen,Base);
        s = (tchar_t*)GetProtocol(Abs,NULL,0,&HasHost);
        if (!HasHost)
        {
            // keep "mime://" from Base
            ++Path;
            *s = 0;
        }
        else
        {
            // keep "mime://host" from Base
            tchar_t *a,*b;
            a = tcschr(s,'\\');
            b = tcschr(s,'/');
            if (!a || (b && b<a))
                a=b;
            if (a)
                *a=0;
        }
    }
    else
    if (Base && GetProtocol(Path,NULL,0,NULL)==Path && Path[0] != '/' && Path[0] != '\\' &&
        !(Path[0] && Path[1]==':' && (Path[2]=='\\' || Path[2]=='\0')))
    {
        // doesn't have mime or drive letter or pathdelimiter at the start
        const tchar_t* MimeEnd = GetProtocol(Base,NULL,0,NULL);
        tcscpy_s(Abs,AbsLen,Base);

#if defined(TARGET_WIN)
        if (MimeEnd==Base)
            AddPathDelimiter(Abs,AbsLen);
        else
#endif
        if (MimeEnd[0])
            AddPathDelimiter(Abs,AbsLen);
    }
    else
        Abs[0] = 0;

    tcscat_s(Abs,AbsLen,Path);
    AbsPathNormalize(Abs);
}